

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VDUP(DisasContext_conflict1 *s,arg_VDUP *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  int iVar2;
  uint32_t oprsz;
  TCGv_i32 in;
  long lVar3;
  uint local_34;
  int vec_size;
  int size;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_VDUP *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar2 = arm_dc_feature(s,8);
  if (iVar2 == 0) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = isar_feature_aa32_simd_r32(s->isar);
    if ((_Var1) || ((a->vn & 0x10U) == 0)) {
      if ((a->b == 0) || (a->e == 0)) {
        if ((a->q == 0) || ((a->vn & 1U) == 0)) {
          oprsz = 8;
          if (a->q != 0) {
            oprsz = 0x10;
          }
          if (a->b == 0) {
            if (a->e == 0) {
              local_34 = 2;
            }
            else {
              local_34 = 1;
            }
          }
          else {
            local_34 = 0;
          }
          _Var1 = vfp_access_check(s);
          if (_Var1) {
            in = load_reg(s,a->rt);
            lVar3 = neon_reg_offset(a->vn,0);
            tcg_gen_gvec_dup_i32_aarch64(tcg_ctx_00,local_34,(uint32_t)lVar3,oprsz,oprsz,in);
            tcg_temp_free_i32(tcg_ctx_00,in);
            s_local._7_1_ = true;
          }
          else {
            s_local._7_1_ = true;
          }
        }
        else {
          s_local._7_1_ = false;
        }
      }
      else {
        s_local._7_1_ = false;
      }
    }
    else {
      s_local._7_1_ = false;
    }
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VDUP(DisasContext *s, arg_VDUP *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* VDUP (general purpose register) */
    TCGv_i32 tmp;
    int size, vec_size;

    if (!arm_dc_feature(s, ARM_FEATURE_NEON)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vn & 0x10)) {
        return false;
    }

    if (a->b && a->e) {
        return false;
    }

    if (a->q && (a->vn & 1)) {
        return false;
    }

    vec_size = a->q ? 16 : 8;
    if (a->b) {
        size = 0;
    } else if (a->e) {
        size = 1;
    } else {
        size = 2;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    tmp = load_reg(s, a->rt);
    tcg_gen_gvec_dup_i32(tcg_ctx, size, neon_reg_offset(a->vn, 0),
                         vec_size, vec_size, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);

    return true;
}